

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.h
# Opt level: O2

void __thiscall
Js::DynamicObject::InvalidateHasOnlyWritableDataPropertiesInPrototypeChainCacheIfPrototype
          (DynamicObject *this)

{
  WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_> local_18;
  
  local_18.ptr = (PrototypeChainCache<Js::OnlyWritablePropertyCache> *)
                 (this->super_RecyclableObject).type.ptr;
  if ((*(byte *)(*(long *)&((local_18.ptr)->types).field_0x28 + 9) & 0x20) != 0) {
    Memory::WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
    WriteBarrierSet(&local_18,
                    &((Type *)&((local_18.ptr)->types).
                               super_ReadOnlyList<Js::Type_*,_Memory::Recycler,_DefaultComparer>.
                               buffer)->ptr->typesWithOnlyWritablePropertyProtoChain);
    PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(local_18.ptr);
  }
  return;
}

Assistant:

inline Type * GetType() const { return type; }